

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O1

void __thiscall TestSuite::~TestSuite(TestSuite *this)

{
  ~TestSuite(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

virtual ~TestSuite()
	{
		for ( int i = 0; i < (int)mTestCases.size(); i++ )
		{
			delete mTestCases[ i ];
		}
	}